

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::IRenderPass> * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetRenderPassPtr
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  char (*in_RCX) [37];
  string msg;
  string local_30;
  
  if (((this->
       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
       ).m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) != PIPELINE_TYPE_GRAPHICS) {
    FormatString<char[26],char[37]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsAnyGraphicsPipeline()",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRenderPassPtr",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1ff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return &((this->field_6).m_pGraphicsPipelineData)->pRenderPass;
}

Assistant:

RefCntAutoPtr<IRenderPass> const& GetRenderPassPtr() const
    {
        VERIFY_EXPR(this->m_Desc.IsAnyGraphicsPipeline());
        return m_pGraphicsPipelineData->pRenderPass;
    }